

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 40.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Type<40>::Type(Type<40> *this,Type<40> *param_1)

{
  double dVar1;
  undefined4 uVar2;
  
  uVar2 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  (this->super_Base).MT_ = (param_1->super_Base).MT_;
  *(undefined4 *)&(this->super_Base).field_0x14 = uVar2;
  uVar2 = *(undefined4 *)
           &(param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4;
  dVar1 = (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_ =
       (param_1->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.ZA_;
  *(undefined4 *)&(this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.field_0x4 =
       uVar2;
  (this->super_Base).super_BaseWithoutMT<njoy::ENDFtk::section::Base>.atomicWeightRatio_ = dVar1;
  *(undefined4 *)&(this->super_Base).field_0x14 = *(undefined4 *)&(param_1->super_Base).field_0x14;
  std::
  vector<njoy::ENDFtk::section::Type<40>::LevelBlock,_std::allocator<njoy::ENDFtk::section::Type<40>::LevelBlock>_>
  ::vector(&this->levelBlocks_,&param_1->levelBlocks_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT Type< 40 > : protected Base {

  public:

    // include classes for subsections
    #include "ENDFtk/section/40/LevelBlock.hpp"

  private:

    /* fields */
    int lis_;
    std::vector< LevelBlock > levelBlocks_;

    /* auxiliary functions */

  public:

    /* constructor */
    #include "ENDFtk/section/40/src/ctor.hpp"

    /* methods */

    /**
     *  @brief Return the excited level number of the target
     */
    int LIS() const { return this->lis_; }

    /**
     *  @brief Return the excited level number of the target
     */
    int excitedLevel() const { return this->LIS(); }

    /**
     *  @brief Return the number of subsections
     */
    int NS() const { return this->levelBlocks_.size(); }

    /**
     *  @brief Return the number of subsections, representing levels
     */
    int numberLevelBlocks() const { return this->NS(); }

    /**
     *  @brief Return the subsections defined in this section
     */
    auto levelBlocks() const {

      return ranges::cpp20::views::all( this->levelBlocks_ );
    }

    #include "ENDFtk/section/40/src/NC.hpp"
    #include "ENDFtk/section/40/src/print.hpp"

    using Base::MT;
    using Base::sectionNumber;
    using Base::ZA;
    using Base::targetIdentifier;
    using Base::atomicWeightRatio;
    using Base::AWR;
  }